

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void fmt::v10::detail::
     handle_dynamic_spec<fmt::v10::detail::precision_checker,fmt::v10::basic_format_context<fmt::v10::appender,char>>
               (int *value,arg_ref<char> ref,basic_format_context<fmt::v10::appender,_char> *ctx)

{
  basic_format_arg<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> arg;
  basic_format_arg<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> arg_00;
  basic_string_view<char> id;
  int iVar1;
  int *in_RDI;
  int in_stack_00000008;
  undefined1 auStack0000000000000070 [16];
  undefined4 uStack0000000000000080;
  undefined4 uStack0000000000000084;
  undefined8 in_stack_ffffffffffffff78;
  basic_format_context<fmt::v10::appender,_char> *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff90;
  
  if (in_stack_00000008 != 0) {
    if (in_stack_00000008 == 1) {
      get_arg<fmt::v10::basic_format_context<fmt::v10::appender,char>,int>
                (in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
      arg._24_8_ = ctx;
      arg.value_.field_0 =
           (anon_union_16_16_d721ec3a_for_value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_1
            )auStack0000000000000070;
      arg.type_ = uStack0000000000000080;
      arg._20_4_ = uStack0000000000000084;
      iVar1 = get_dynamic_spec<fmt::v10::detail::precision_checker,fmt::v10::basic_format_arg<fmt::v10::basic_format_context<fmt::v10::appender,char>>>
                        (arg);
      *in_RDI = iVar1;
    }
    else if (in_stack_00000008 == 2) {
      id.size_._0_4_ = in_stack_ffffffffffffff90;
      id.data_ = (char *)&stack0x00000008;
      id.size_._4_4_ = 2;
      get_arg<fmt::v10::basic_format_context<fmt::v10::appender,char>,fmt::v10::basic_string_view<char>>
                (in_stack_ffffffffffffff80,id);
      arg_00._24_8_ = ctx;
      arg_00.value_.field_0 =
           (anon_union_16_16_d721ec3a_for_value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_1
            )auStack0000000000000070;
      arg_00.type_ = uStack0000000000000080;
      arg_00._20_4_ = uStack0000000000000084;
      iVar1 = get_dynamic_spec<fmt::v10::detail::precision_checker,fmt::v10::basic_format_arg<fmt::v10::basic_format_context<fmt::v10::appender,char>>>
                        (arg_00);
      *in_RDI = iVar1;
    }
  }
  return;
}

Assistant:

FMT_CONSTEXPR void handle_dynamic_spec(int& value,
                                       arg_ref<typename Context::char_type> ref,
                                       Context& ctx) {
  switch (ref.kind) {
  case arg_id_kind::none:
    break;
  case arg_id_kind::index:
    value = detail::get_dynamic_spec<Handler>(get_arg(ctx, ref.val.index));
    break;
  case arg_id_kind::name:
    value = detail::get_dynamic_spec<Handler>(get_arg(ctx, ref.val.name));
    break;
  }
}